

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lauxlib.c
# Opt level: O1

int luaL_loadfilex(lua_State *L,char *filename,char *mode)

{
  FILE *__stream;
  int iVar1;
  int iVar2;
  int iVar3;
  int *piVar4;
  long lVar5;
  char *pcVar6;
  int c;
  LoadF lf;
  int local_2044;
  int local_2040 [2];
  FILE *local_2038;
  undefined1 auStack_2030 [8192];
  
  iVar1 = lua_gettop(L);
  iVar1 = iVar1 + 1;
  if (filename == (char *)0x0) {
    lua_pushstring(L,"=stdin");
    local_2038 = _stdin;
  }
  else {
    lua_pushfstring(L,"@%s",filename);
    piVar4 = __errno_location();
    *piVar4 = 0;
    local_2038 = fopen64(filename,"r");
    if (local_2038 == (FILE *)0x0) {
      pcVar6 = "open";
      goto LAB_00107afe;
    }
  }
  local_2040[0] = 0;
  iVar2 = skipcomment((FILE *)local_2038,&local_2044);
  if (iVar2 != 0) {
    lVar5 = (long)local_2040[0];
    local_2040[0] = local_2040[0] + 1;
    auStack_2030[lVar5] = 10;
  }
  if ((local_2044 == 0x1b) && (local_2040[0] = 0, filename != (char *)0x0)) {
    piVar4 = __errno_location();
    *piVar4 = 0;
    local_2038 = freopen64(filename,"rb",local_2038);
    if (local_2038 == (FILE *)0x0) {
      pcVar6 = "reopen";
      goto LAB_00107afe;
    }
    skipcomment((FILE *)local_2038,&local_2044);
  }
  if (local_2044 != -1) {
    lVar5 = (long)local_2040[0];
    local_2040[0] = local_2040[0] + 1;
    auStack_2030[lVar5] = (char)local_2044;
  }
  piVar4 = __errno_location();
  *piVar4 = 0;
  pcVar6 = lua_tolstring(L,-1,(size_t *)0x0);
  iVar2 = lua_load(L,getF,local_2040,pcVar6,mode);
  __stream = local_2038;
  iVar3 = ferror(local_2038);
  if (filename != (char *)0x0) {
    fclose(__stream);
  }
  if (iVar3 == 0) {
    lua_rotate(L,iVar1,-1);
    lua_settop(L,-2);
    return iVar2;
  }
  lua_settop(L,iVar1);
  pcVar6 = "read";
LAB_00107afe:
  errfile(L,pcVar6,iVar1);
  return 6;
}

Assistant:

LUALIB_API int luaL_loadfilex (lua_State *L, const char *filename,
                                             const char *mode) {
  LoadF lf;
  int status, readstatus;
  int c;
  int fnameindex = lua_gettop(L) + 1;  /* index of filename on the stack */
  if (filename == NULL) {
    lua_pushliteral(L, "=stdin");
    lf.f = stdin;
  }
  else {
    lua_pushfstring(L, "@%s", filename);
    errno = 0;
    lf.f = fopen(filename, "r");
    if (lf.f == NULL) return errfile(L, "open", fnameindex);
  }
  lf.n = 0;
  if (skipcomment(lf.f, &c))  /* read initial portion */
    lf.buff[lf.n++] = '\n';  /* add newline to correct line numbers */
  if (c == LUA_SIGNATURE[0]) {  /* binary file? */
    lf.n = 0;  /* remove possible newline */
    if (filename) {  /* "real" file? */
      errno = 0;
      lf.f = freopen(filename, "rb", lf.f);  /* reopen in binary mode */
      if (lf.f == NULL) return errfile(L, "reopen", fnameindex);
      skipcomment(lf.f, &c);  /* re-read initial portion */
    }
  }
  if (c != EOF)
    lf.buff[lf.n++] = c;  /* 'c' is the first character of the stream */
  errno = 0;
  status = lua_load(L, getF, &lf, lua_tostring(L, -1), mode);
  readstatus = ferror(lf.f);
  if (filename) fclose(lf.f);  /* close file (even in case of errors) */
  if (readstatus) {
    lua_settop(L, fnameindex);  /* ignore results from 'lua_load' */
    return errfile(L, "read", fnameindex);
  }
  lua_remove(L, fnameindex);
  return status;
}